

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void cmExtraEclipseCDT4Generator::AppendTarget
               (cmGeneratedFileStream *fout,string *target,string *make,string *makeArgs,
               string *path,char *prefix,char *makeTarget)

{
  ostream *poVar1;
  string pathXml;
  string makeTargetXml;
  string targetXml;
  allocator local_d9;
  string *local_d8;
  string local_d0;
  string local_b0;
  string local_90 [32];
  string local_70;
  string local_50;
  
  local_d8 = makeArgs;
  EscapeForXML(&local_70,target);
  std::__cxx11::string::string(local_90,(string *)&local_70);
  if (makeTarget != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_d0,makeTarget,&local_d9);
    EscapeForXML(&local_b0,&local_d0);
    std::__cxx11::string::operator=(local_90,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  EscapeForXML(&local_50,target);
  std::__cxx11::string::~string((string *)&local_50);
  EscapeForXML(&local_b0,path);
  poVar1 = std::operator<<((ostream *)fout,"<target name=\"");
  poVar1 = std::operator<<(poVar1,prefix);
  poVar1 = std::operator<<(poVar1,(string *)&local_70);
  poVar1 = std::operator<<(poVar1,"\" path=\"");
  poVar1 = std::operator<<(poVar1,(string *)&local_b0);
  poVar1 = std::operator<<(poVar1,
                           "\" targetID=\"org.eclipse.cdt.make.MakeTargetBuilder\">\n<buildCommand>"
                          );
  std::__cxx11::string::string((string *)&local_d0,(string *)make);
  poVar1 = std::operator<<(poVar1,(string *)&local_d0);
  poVar1 = std::operator<<(poVar1,"</buildCommand>\n<buildArguments>");
  poVar1 = std::operator<<(poVar1,(string *)local_d8);
  poVar1 = std::operator<<(poVar1,"</buildArguments>\n<buildTarget>");
  poVar1 = std::operator<<(poVar1,local_90);
  std::operator<<(poVar1,
                  "</buildTarget>\n<stopOnError>true</stopOnError>\n<useDefaultCommand>false</useDefaultCommand>\n</target>\n"
                 );
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AppendTarget(cmGeneratedFileStream& fout,
                                               const std::string&     target,
                                               const std::string&     make,
                                               const std::string&     makeArgs,
                                               const std::string&     path,
                                               const char* prefix,
                                               const char* makeTarget
                                              )
{
  std::string targetXml = cmExtraEclipseCDT4Generator::EscapeForXML(target);
  std::string makeTargetXml = targetXml;
  if (makeTarget != NULL)
    {
    makeTargetXml = cmExtraEclipseCDT4Generator::EscapeForXML(makeTarget);
    }
  cmExtraEclipseCDT4Generator::EscapeForXML(target);
  std::string pathXml = cmExtraEclipseCDT4Generator::EscapeForXML(path);
  fout <<
    "<target name=\"" << prefix << targetXml << "\""
    " path=\"" << pathXml << "\""
    " targetID=\"org.eclipse.cdt.make.MakeTargetBuilder\">\n"
    "<buildCommand>"
    << cmExtraEclipseCDT4Generator::GetEclipsePath(make)
    << "</buildCommand>\n"
    "<buildArguments>"  << makeArgs << "</buildArguments>\n"
    "<buildTarget>" << makeTargetXml << "</buildTarget>\n"
    "<stopOnError>true</stopOnError>\n"
    "<useDefaultCommand>false</useDefaultCommand>\n"
    "</target>\n"
    ;
}